

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psquare_suite.cpp
# Opt level: O1

void double_90_suite::test_linear_increase(void)

{
  value_type_conflict *pvVar1;
  psquare<double,_std::ratio<9L,_10L>_> quantile;
  value_type_conflict local_e8 [2];
  psquare<double,_std::ratio<9L,_10L>_> local_d8;
  
  local_d8.count = 0;
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::initialize(&local_d8);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,1.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  pvVar1 = local_e8 + 1;
  local_e8[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x331,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,2.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 1.9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","1.9",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x333,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,3.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 2.8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","2.8",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x335,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,4.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 3.7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","3.7",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x337,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,5.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 4.6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","4.6",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x339,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,6.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 3.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","3.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x33e,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,7.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 4.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","4.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x340,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,8.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 5.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","5.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x342,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,9.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 6.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","6.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x344,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,10.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 7.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","7.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x346,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  trial::online::quantile::psquare<double,_std::ratio<9L,_10L>_>::push(&local_d8,11.0);
  local_e8[0] = trial::online::quantile::psquare<double,std::ratio<9l,10l>>::get<1ul>
                          ((psquare<double,std::ratio<9l,10l>> *)&local_d8);
  local_e8[1] = 8.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("quantile.value()","8.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,0x348,"void double_90_suite::test_linear_increase()",local_e8,pvVar1);
  return;
}

Assistant:

void test_linear_increase()
{
    quantile::psquare<double, upper_decile_ratio> quantile;
    quantile.push(1.0);
    TRIAL_TEST_EQ(quantile.value(), 1.0);
    quantile.push(2.0);
    TRIAL_TEST_EQ(quantile.value(), 1.9);
    quantile.push(3.0);
    TRIAL_TEST_EQ(quantile.value(), 2.8);
    quantile.push(4.0);
    TRIAL_TEST_EQ(quantile.value(), 3.7);
    quantile.push(5.0);
    TRIAL_TEST_EQ(quantile.value(), 4.6);

    // Switch to approximation

    quantile.push(6.0);
    TRIAL_TEST_EQ(quantile.value(), 3.0); // 5.5
    quantile.push(7.0);
    TRIAL_TEST_EQ(quantile.value(), 4.0); // 6.4
    quantile.push(8.0);
    TRIAL_TEST_EQ(quantile.value(), 5.0); // 7.3
    quantile.push(9.0);
    TRIAL_TEST_EQ(quantile.value(), 6.0); // 8.2
    quantile.push(10.0);
    TRIAL_TEST_EQ(quantile.value(), 7.0); // 9.1
    quantile.push(11.0);
    TRIAL_TEST_EQ(quantile.value(), 8.0); // 10.0
}